

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int decode_jpeg_header(jpeg *z,int scan)

{
  uint8 uVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int unaff_retaddr;
  jpeg *in_stack_00000008;
  int m;
  int in_stack_00000054;
  jpeg *in_stack_00000058;
  jpeg *in_stack_ffffffffffffffd8;
  int local_4;
  
  *(undefined1 *)(in_RDI + 0x36e8) = 0xff;
  uVar1 = get_marker(in_stack_ffffffffffffffd8);
  if (uVar1 == 0xd8) {
    if (in_ESI == 1) {
      local_4 = 1;
    }
    else {
      uVar1 = get_marker(in_stack_ffffffffffffffd8);
      while (uVar1 != 0xc0 && uVar1 != 0xc1) {
        iVar2 = process_marker(in_stack_00000058,in_stack_00000054);
        if (iVar2 == 0) {
          return 0;
        }
        uVar1 = get_marker(in_stack_ffffffffffffffd8);
        while (uVar1 == 0xff) {
          iVar2 = at_eof(&in_stack_ffffffffffffffd8->s);
          if (iVar2 != 0) {
            iVar2 = e("Corrupt JPEG");
            return iVar2;
          }
          uVar1 = get_marker(in_stack_ffffffffffffffd8);
        }
      }
      iVar2 = process_frame_header(in_stack_00000008,unaff_retaddr);
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = e("Corrupt JPEG");
  }
  return local_4;
}

Assistant:

static int decode_jpeg_header(jpeg *z, int scan)
{
   int m;
   z->marker = MARKER_none; // initialize cached marker to empty
   m = get_marker(z);
   if (!SOI(m)) return e("no SOI","Corrupt JPEG");
   if (scan == SCAN_type) return 1;
   m = get_marker(z);
   while (!SOF(m)) {
      if (!process_marker(z,m)) return 0;
      m = get_marker(z);
      while (m == MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (at_eof(&z->s)) return e("no SOF", "Corrupt JPEG");
         m = get_marker(z);
      }
   }
   if (!process_frame_header(z, scan)) return 0;
   return 1;
}